

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_metadata.cc
# Opt level: O1

void __thiscall
draco::GeometryMetadata::GeometryMetadata(GeometryMetadata *this,GeometryMetadata *metadata)

{
  AttributeMetadata *metadata_00;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> this_00;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> this_01;
  ulong uVar1;
  pointer puVar2;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> local_40;
  GeometryMetadata *local_38;
  
  Metadata::Metadata(&this->super_Metadata,&metadata->super_Metadata);
  (this->att_metadatas_).
  super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->att_metadatas_).
  super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->att_metadatas_).
  super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (metadata->att_metadatas_).
           super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((metadata->att_metadatas_).
      super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    uVar1 = 0;
    local_38 = this;
    do {
      this_01._M_head_impl = (AttributeMetadata *)operator_new(0x68);
      metadata_00 = puVar2[uVar1]._M_t.
                    super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                    .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
      Metadata::Metadata((Metadata *)this_01._M_head_impl,&metadata_00->super_Metadata);
      (this_01._M_head_impl)->att_unique_id_ = metadata_00->att_unique_id_;
      local_40._M_t.
      super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
      .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
            )(__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
              )this_01._M_head_impl;
      std::
      vector<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>,std::allocator<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>>>
      ::
      emplace_back<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>>
                ((vector<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>,std::allocator<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>>>
                  *)&this->att_metadatas_,&local_40);
      this_00._M_t.
      super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
      .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
           local_40._M_t.
           super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
           .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
      if (local_40._M_t.
          super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
          ._M_t.
          super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
          .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
          )0x0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
                     *)((long)local_40._M_t.
                              super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                              .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl
                       + 0x30));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                     *)this_00._M_t.
                       super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                       .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl);
        operator_delete((void *)this_00._M_t.
                                super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                                .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>.
                                _M_head_impl,0x68);
      }
      uVar1 = uVar1 + 1;
      puVar2 = (metadata->att_metadatas_).
               super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar1 < (ulong)((long)(metadata->att_metadatas_).
                                   super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
  }
  return;
}

Assistant:

GeometryMetadata::GeometryMetadata(const GeometryMetadata &metadata)
    : Metadata(metadata) {
  for (size_t i = 0; i < metadata.att_metadatas_.size(); ++i) {
    att_metadatas_.push_back(std::unique_ptr<AttributeMetadata>(
        new AttributeMetadata(*metadata.att_metadatas_[i])));
  }
}